

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

void __thiscall nuraft::buffer_serializer::put_i8(buffer_serializer *this,int8_t val)

{
  bool bVar1;
  byte *pbVar2;
  overflow_error *this_00;
  
  bVar1 = is_valid(this,1);
  if (bVar1) {
    pbVar2 = buffer::data_begin(this->buf_);
    pbVar2[this->pos_] = val;
    pos(this,this->pos_ + 1);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_i8(int8_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    ptr[0] = val;
    pos( pos() + sizeof(val) );
}